

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O3

string_t __thiscall
duckdb::HexStrOperator::Operation<duckdb::string_t,duckdb::string_t>
          (HexStrOperator *this,string_t input,Vector *result)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  string_t sVar4;
  string_t target;
  undefined1 local_38 [16];
  undefined8 local_28;
  long local_20;
  
  local_20 = input.value._0_8_;
  lVar3 = local_20;
  if ((uint)this < 0xd) {
    lVar3 = (long)&local_28 + 4;
  }
  local_28 = this;
  local_38 = (undefined1  [16])
             StringVector::EmptyString
                       (input.value._8_8_,(Vector *)(((ulong)this & 0xffffffff) * 2),
                        (idx_t)input.value._8_8_);
  uVar1 = local_38._0_8_;
  if ((uint)this != 0) {
    pcVar2 = (char *)local_38._8_8_;
    if ((uint)local_38._0_4_ < 0xd) {
      pcVar2 = local_38 + 4;
    }
    uVar1 = 0;
    do {
      pcVar2[uVar1 * 2] = "0123456789ABCDEF"[*(byte *)(lVar3 + uVar1) >> 4];
      pcVar2[uVar1 * 2 + 1] = "0123456789ABCDEF"[*(byte *)(lVar3 + uVar1) & 0xf];
      uVar1 = uVar1 + 1;
    } while (((ulong)this & 0xffffffff) != uVar1);
    uVar1 = (ulong)(uint)local_38._0_4_;
  }
  if ((uint)uVar1 < 0xd) {
    switchD_01043a80::default(local_38 + 4 + (uVar1 & 0xffffffff),0,0xc - (uVar1 & 0xffffffff));
  }
  else {
    local_38._4_4_ = *(undefined4 *)local_38._8_8_;
  }
  sVar4.value.pointer.ptr = (char *)local_38._8_8_;
  sVar4.value._0_8_ = local_38._0_8_;
  return (string_t)sVar4.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		// Allocate empty space
		auto target = StringVector::EmptyString(result, size * 2);
		auto output = target.GetDataWriteable();

		for (idx_t i = 0; i < size; ++i) {
			*output = Blob::HEX_TABLE[(data[i] >> 4) & 0x0F];
			output++;
			*output = Blob::HEX_TABLE[data[i] & 0x0F];
			output++;
		}

		target.Finalize();
		return target;
	}